

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

void __thiscall
google::protobuf::FieldDescriptor::CopyTo(FieldDescriptor *this,FieldDescriptorProto *proto)

{
  byte *pbVar1;
  int32 iVar2;
  uint uVar3;
  int iVar4;
  string *psVar5;
  string *psVar6;
  GoogleOnceDynamic *this_00;
  long lVar7;
  long lVar8;
  bool bVar9;
  FieldOptions *pFVar10;
  FieldOptions *pFVar11;
  FieldDescriptor *pFVar12;
  string local_48;
  
  psVar5 = *(string **)this;
  (proto->_has_bits_).has_bits_[0] = (proto->_has_bits_).has_bits_[0] | 1;
  psVar6 = (proto->name_).ptr_;
  if (psVar6 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
    internal::ArenaStringPtr::CreateInstanceNoArena(&proto->name_,psVar5);
  }
  else {
    std::__cxx11::string::_M_assign((string *)psVar6);
  }
  iVar2 = *(int32 *)(this + 0x38);
  uVar3 = (proto->_has_bits_).has_bits_[0];
  (proto->_has_bits_).has_bits_[0] = uVar3 | 0x40;
  proto->number_ = iVar2;
  if (this[0x20] == (FieldDescriptor)0x1) {
    psVar5 = *(string **)(this + 0x28);
    (proto->_has_bits_).has_bits_[0] = uVar3 | 0x50;
    psVar6 = (proto->json_name_).ptr_;
    if (psVar6 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
      internal::ArenaStringPtr::CreateInstanceNoArena(&proto->json_name_,psVar5);
    }
    else {
      std::__cxx11::string::_M_assign((string *)psVar6);
    }
  }
  iVar4 = *(int *)(this + 0x4c);
  bVar9 = FieldDescriptorProto_Label_IsValid(iVar4);
  if (!bVar9) {
    __assert_fail("::google::protobuf::FieldDescriptorProto_Label_IsValid(value)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.pb.h"
                  ,0x1487,
                  "void google::protobuf::FieldDescriptorProto::set_label(::google::protobuf::FieldDescriptorProto_Label)"
                 );
  }
  pbVar1 = (byte *)((long)(proto->_has_bits_).has_bits_ + 1);
  *pbVar1 = *pbVar1 | 1;
  proto->label_ = iVar4;
  if (*(GoogleOnceDynamic **)(this + 0x40) != (GoogleOnceDynamic *)0x0) {
    GoogleOnceDynamic::Init<google::protobuf::FieldDescriptor_const>
              (*(GoogleOnceDynamic **)(this + 0x40),TypeOnceInit,this);
  }
  iVar4 = *(int *)(this + 0x48);
  bVar9 = FieldDescriptorProto_Type_IsValid(iVar4);
  if (!bVar9) {
    __assert_fail("::google::protobuf::FieldDescriptorProto_Type_IsValid(value)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.pb.h"
                  ,0x14a0,
                  "void google::protobuf::FieldDescriptorProto::set_type(::google::protobuf::FieldDescriptorProto_Type)"
                 );
  }
  uVar3 = (proto->_has_bits_).has_bits_[0];
  (proto->_has_bits_).has_bits_[0] = uVar3 | 0x200;
  proto->type_ = iVar4;
  if (this[0x50] == (FieldDescriptor)0x1) {
    if (*(char *)(*(long *)(this + 0x58) + 0x29) == '\0') {
      (proto->_has_bits_).has_bits_[0] = uVar3 | 0x202;
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,".","");
      internal::ArenaStringPtr::SetNoArena
                (&proto->extendee_,(string *)&internal::fixed_address_empty_string_abi_cxx11_,
                 &local_48);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
    }
    *(byte *)(proto->_has_bits_).has_bits_ = (byte)(proto->_has_bits_).has_bits_[0] | 2;
    if ((proto->extendee_).ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
      internal::ArenaStringPtr::CreateInstanceNoArena
                (&proto->extendee_,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
    }
    std::__cxx11::string::_M_append
              ((char *)(proto->extendee_).ptr_,**(ulong **)(*(long *)(this + 0x58) + 8));
  }
  if (*(GoogleOnceDynamic **)(this + 0x40) != (GoogleOnceDynamic *)0x0) {
    GoogleOnceDynamic::Init<google::protobuf::FieldDescriptor_const>
              (*(GoogleOnceDynamic **)(this + 0x40),TypeOnceInit,this);
  }
  this_00 = *(GoogleOnceDynamic **)(this + 0x40);
  if ((*(uint *)(this + 0x48) & 0xfffffffe) == 10) {
    if (this_00 != (GoogleOnceDynamic *)0x0) {
      GoogleOnceDynamic::Init<google::protobuf::FieldDescriptor_const>(this_00,TypeOnceInit,this);
    }
    if (*(char *)(*(long *)(this + 0x70) + 0x28) == '\x01') {
      proto->type_ = 1;
      pbVar1 = (byte *)((long)(proto->_has_bits_).has_bits_ + 1);
      *pbVar1 = *pbVar1 & 0xfd;
    }
    pFVar12 = this + 0x70;
    if (*(GoogleOnceDynamic **)(this + 0x40) != (GoogleOnceDynamic *)0x0) {
      GoogleOnceDynamic::Init<google::protobuf::FieldDescriptor_const>
                (*(GoogleOnceDynamic **)(this + 0x40),TypeOnceInit,this);
    }
    if (*(char *)(*(long *)pFVar12 + 0x29) == '\0') {
      *(byte *)(proto->_has_bits_).has_bits_ = (byte)(proto->_has_bits_).has_bits_[0] | 4;
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,".","");
      internal::ArenaStringPtr::SetNoArena
                (&proto->type_name_,(string *)&internal::fixed_address_empty_string_abi_cxx11_,
                 &local_48);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
    }
    *(byte *)(proto->_has_bits_).has_bits_ = (byte)(proto->_has_bits_).has_bits_[0] | 4;
    if ((proto->type_name_).ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
      internal::ArenaStringPtr::CreateInstanceNoArena
                (&proto->type_name_,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
    }
  }
  else {
    if (this_00 != (GoogleOnceDynamic *)0x0) {
      GoogleOnceDynamic::Init<google::protobuf::FieldDescriptor_const>(this_00,TypeOnceInit,this);
    }
    if (*(int *)(this + 0x48) != 0xe) goto LAB_002d9dca;
    if (*(GoogleOnceDynamic **)(this + 0x40) != (GoogleOnceDynamic *)0x0) {
      GoogleOnceDynamic::Init<google::protobuf::FieldDescriptor_const>
                (*(GoogleOnceDynamic **)(this + 0x40),TypeOnceInit,this);
    }
    if (*(char *)(*(long *)(this + 0x78) + 0x29) == '\0') {
      *(byte *)(proto->_has_bits_).has_bits_ = (byte)(proto->_has_bits_).has_bits_[0] | 4;
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,".","");
      internal::ArenaStringPtr::SetNoArena
                (&proto->type_name_,(string *)&internal::fixed_address_empty_string_abi_cxx11_,
                 &local_48);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
    }
    *(byte *)(proto->_has_bits_).has_bits_ = (byte)(proto->_has_bits_).has_bits_[0] | 4;
    if ((proto->type_name_).ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
      internal::ArenaStringPtr::CreateInstanceNoArena
                (&proto->type_name_,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
    }
    pFVar12 = this + 0x78;
  }
  psVar5 = (proto->type_name_).ptr_;
  if (*(GoogleOnceDynamic **)(this + 0x40) != (GoogleOnceDynamic *)0x0) {
    GoogleOnceDynamic::Init<google::protobuf::FieldDescriptor_const>
              (*(GoogleOnceDynamic **)(this + 0x40),TypeOnceInit,this);
  }
  std::__cxx11::string::_M_append((char *)psVar5,**(ulong **)(*(long *)pFVar12 + 8));
LAB_002d9dca:
  if (this[0x98] == (FieldDescriptor)0x1) {
    DefaultValueAsString_abi_cxx11_(&local_48,this,false);
    *(byte *)(proto->_has_bits_).has_bits_ = (byte)(proto->_has_bits_).has_bits_[0] | 8;
    internal::ArenaStringPtr::SetNoArena
              (&proto->default_value_,(string *)&internal::fixed_address_empty_string_abi_cxx11_,
               &local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  lVar7 = *(long *)(this + 0x60);
  if ((lVar7 != 0) && (this[0x50] == (FieldDescriptor)0x0)) {
    lVar8 = *(long *)(*(long *)(lVar7 + 0x10) + 0x40);
    (proto->_has_bits_).has_bits_[0] = (proto->_has_bits_).has_bits_[0] | 0x80;
    proto->oneof_index_ = (int)((ulong)(lVar7 - lVar8) >> 4) * -0x55555555;
  }
  pFVar11 = *(FieldOptions **)(this + 0x80);
  pFVar10 = FieldOptions::default_instance();
  if (pFVar11 != pFVar10) {
    *(byte *)(proto->_has_bits_).has_bits_ = (byte)(proto->_has_bits_).has_bits_[0] | 0x20;
    if (proto->options_ == (FieldOptions *)0x0) {
      pFVar11 = (FieldOptions *)operator_new(0x78);
      FieldOptions::FieldOptions(pFVar11);
      proto->options_ = pFVar11;
    }
    FieldOptions::CopyFrom(proto->options_,*(FieldOptions **)(this + 0x80));
  }
  return;
}

Assistant:

void FieldDescriptor::CopyTo(FieldDescriptorProto* proto) const {
  proto->set_name(name());
  proto->set_number(number());
  if (has_json_name_) {
    proto->set_json_name(json_name());
  }

  // Some compilers do not allow static_cast directly between two enum types,
  // so we must cast to int first.
  proto->set_label(static_cast<FieldDescriptorProto::Label>(
                     implicit_cast<int>(label())));
  proto->set_type(static_cast<FieldDescriptorProto::Type>(
                    implicit_cast<int>(type())));

  if (is_extension()) {
    if (!containing_type()->is_unqualified_placeholder_) {
      proto->set_extendee(".");
    }
    proto->mutable_extendee()->append(containing_type()->full_name());
  }

  if (cpp_type() == CPPTYPE_MESSAGE) {
    if (message_type()->is_placeholder_) {
      // We don't actually know if the type is a message type.  It could be
      // an enum.
      proto->clear_type();
    }

    if (!message_type()->is_unqualified_placeholder_) {
      proto->set_type_name(".");
    }
    proto->mutable_type_name()->append(message_type()->full_name());
  } else if (cpp_type() == CPPTYPE_ENUM) {
    if (!enum_type()->is_unqualified_placeholder_) {
      proto->set_type_name(".");
    }
    proto->mutable_type_name()->append(enum_type()->full_name());
  }

  if (has_default_value()) {
    proto->set_default_value(DefaultValueAsString(false));
  }

  if (containing_oneof() != NULL && !is_extension()) {
    proto->set_oneof_index(containing_oneof()->index());
  }

  if (&options() != &FieldOptions::default_instance()) {
    proto->mutable_options()->CopyFrom(options());
  }
}